

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Shutdown(ImGuiContext *context)

{
  ImVector<ImGuiWindow_*> *this;
  ImVector<ImGuiViewportP_*> *this_00;
  ImFontAtlas *p;
  char *ini_filename;
  ImFileHandle f;
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiViewportP **ppIVar3;
  int i;
  int iVar4;
  ImGuiContext *backup_context;
  
  p = (context->IO).Fonts;
  if ((p != (ImFontAtlas *)0x0) && (context->FontAtlasOwnedByContext == true)) {
    p->Locked = false;
    IM_DELETE<ImFontAtlas>(p);
  }
  (context->IO).Fonts = (ImFontAtlas *)0x0;
  pIVar1 = GImGui;
  if (context->Initialized == true) {
    if ((context->SettingsLoaded != false) &&
       (ini_filename = (context->IO).IniFilename, ini_filename != (char *)0x0)) {
      GImGui = context;
      SaveIniSettingsToDisk(ini_filename);
    }
    GImGui = context;
    DestroyPlatformWindows();
    GImGui = pIVar1;
    DockContextShutdown(context);
    CallContextHooks(context,ImGuiContextHookType_Shutdown);
    this = &context->Windows;
    for (iVar4 = 0; iVar4 < this->Size; iVar4 = iVar4 + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,iVar4);
      IM_DELETE<ImGuiWindow>(*ppIVar2);
    }
    ImVector<ImGuiWindow_*>::clear(this);
    ImVector<ImGuiWindow_*>::clear(&context->WindowsFocusOrder);
    ImVector<ImGuiWindow_*>::clear(&context->WindowsTempSortBuffer);
    context->CurrentWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiWindow_*>::clear(&context->CurrentWindowStack);
    ImVector<ImGuiStorage::ImGuiStoragePair>::clear(&(context->WindowsById).Data);
    context->NavWindow = (ImGuiWindow *)0x0;
    context->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
    context->ActiveIdWindow = (ImGuiWindow *)0x0;
    context->MovingWindow = (ImGuiWindow *)0x0;
    context->HoveredWindow = (ImGuiWindow *)0x0;
    context->HoveredRootWindow = (ImGuiWindow *)0x0;
    context->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiColorMod>::clear(&context->ColorModifiers);
    ImVector<ImGuiStyleMod>::clear(&context->StyleModifiers);
    ImVector<ImFont_*>::clear(&context->FontStack);
    ImVector<ImGuiPopupData>::clear(&context->OpenPopupStack);
    ImVector<ImGuiPopupData>::clear(&context->BeginPopupStack);
    this_00 = &context->Viewports;
    context->CurrentViewport = (ImGuiViewportP *)0x0;
    context->MouseViewport = (ImGuiViewportP *)0x0;
    context->MouseLastHoveredViewport = (ImGuiViewportP *)0x0;
    for (iVar4 = 0; iVar4 < this_00->Size; iVar4 = iVar4 + 1) {
      ppIVar3 = ImVector<ImGuiViewportP_*>::operator[](this_00,iVar4);
      IM_DELETE<ImGuiViewportP>(*ppIVar3);
    }
    ImVector<ImGuiViewportP_*>::clear(this_00);
    ImPool<ImGuiTabBar>::Clear(&context->TabBars);
    ImVector<ImGuiPtrOrIndex>::clear(&context->CurrentTabBarStack);
    ImVector<ImGuiShrinkWidthItem>::clear(&context->ShrinkWidthBuffer);
    ImVector<char>::clear(&context->ClipboardHandlerData);
    ImVector<unsigned_int>::clear(&context->MenusIdSubmittedThisFrame);
    ImGuiInputTextState::ClearFreeMemory(&context->InputTextState);
    ImVector<char>::clear(&(context->SettingsWindows).Buf);
    ImVector<ImGuiSettingsHandler>::clear(&context->SettingsHandlers);
    f = context->LogFile;
    if (f != (ImFileHandle)0x0) {
      if (f != _stdout) {
        ImFileClose(f);
      }
      context->LogFile = (ImFileHandle)0x0;
    }
    ImVector<char>::clear(&(context->LogBuffer).Buf);
    context->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown(ImGuiContext* context)
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *context;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
    {
        ImGuiContext* backup_context = GImGui;
        SetCurrentContext(&g);
        SaveIniSettingsToDisk(g.IO.IniFilename);
        SetCurrentContext(backup_context);
    }

    // Destroy platform windows
    ImGuiContext* backup_context = ImGui::GetCurrentContext();
    SetCurrentContext(context);
    DestroyPlatformWindows();
    SetCurrentContext(backup_context);

    // Shutdown extensions
    DockContextShutdown(&g);

    CallContextHooks(&g, ImGuiContextHookType_Shutdown);

    // Clear everything else
    for (int i = 0; i < g.Windows.Size; i++)
        IM_DELETE(g.Windows[i]);
    g.Windows.clear();
    g.WindowsFocusOrder.clear();
    g.WindowsTempSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;
    g.ColorModifiers.clear();
    g.StyleModifiers.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();

    g.CurrentViewport = g.MouseViewport = g.MouseLastHoveredViewport = NULL;
    for (int i = 0; i < g.Viewports.Size; i++)
        IM_DELETE(g.Viewports[i]);
    g.Viewports.clear();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.ClipboardHandlerData.clear();
    g.MenusIdSubmittedThisFrame.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();

    g.Initialized = false;
}